

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O0

void __thiscall
TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test::
~TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test
          (TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test
           *this)

{
  TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test *this_local
  ;
  
  ~TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockHierarchyTest, checkExpectationsWorksHierarchicallyForLastCallNotFinished)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("first::foobar")->withParameter("boo", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "first::foobar", expectations, expectations);

    mock("first").expectOneCall("foobar").withParameter("boo", 1);
    mock("first").actualCall("foobar");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}